

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
          (EpsCopyOutputStream *this,uint32 num,string *s,uint8 *ptr)

{
  uint size;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  byte *pbVar4;
  LogMessage *other;
  uint8 *puVar5;
  uint uVar6;
  byte *pbVar7;
  LogMessage local_78;
  string *local_40;
  LogFinisher local_31;
  
  pbVar4 = EnsureSpace(this,ptr);
  size = (uint)s->_M_string_length;
  if (this->end_ <= pbVar4) {
    local_40 = s;
    internal::LogMessage::LogMessage
              (&local_78,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/io/coded_stream.h"
               ,0x35a);
    other = internal::LogMessage::operator<<(&local_78,"CHECK failed: ptr < end_: ");
    internal::LogFinisher::operator=(&local_31,other);
    internal::LogMessage::~LogMessage(&local_78);
    s = local_40;
  }
  uVar6 = num << 3;
  uVar3 = size;
  if (uVar6 < 0x80) {
    *pbVar4 = (byte)uVar6 | 2;
    pbVar4 = pbVar4 + 1;
  }
  else {
    *pbVar4 = (byte)uVar6 | 0x82;
    if (uVar6 < 0x4000) {
      pbVar4[1] = (byte)(uVar6 >> 7);
      pbVar4 = pbVar4 + 2;
    }
    else {
      pbVar4 = pbVar4 + 2;
      uVar6 = uVar6 >> 7;
      do {
        pbVar7 = pbVar4;
        pbVar7[-1] = (byte)uVar6 | 0x80;
        uVar2 = uVar6 >> 7;
        pbVar4 = pbVar7 + 1;
        bVar1 = 0x3fff < uVar6;
        uVar6 = uVar2;
      } while (bVar1);
      *pbVar7 = (byte)uVar2;
    }
  }
  while( true ) {
    if (uVar3 < 0x80) break;
    *pbVar4 = (byte)uVar3 | 0x80;
    uVar3 = uVar3 >> 7;
    pbVar4 = pbVar4 + 1;
  }
  *pbVar4 = (byte)uVar3;
  puVar5 = WriteRaw(this,(s->_M_dataplus)._M_p,size,pbVar4 + 1);
  return puVar5;
}

Assistant:

uint8* EpsCopyOutputStream::WriteStringOutline(uint32 num, const std::string& s,
                                               uint8* ptr) {
  ptr = EnsureSpace(ptr);
  uint32 size = s.size();
  ptr = WriteLengthDelim(num, size, ptr);
  return WriteRaw(s.data(), size, ptr);
}